

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void release_files(iso9660 *iso9660)

{
  file_info *pfVar1;
  content *pcVar2;
  file_info *next;
  file_info *file;
  content *connext;
  content *con;
  iso9660 *iso9660_local;
  
  next = iso9660->use_files;
  while (next != (file_info *)0x0) {
    pfVar1 = next->use_next;
    archive_string_free(&next->name);
    archive_string_free(&next->symlink);
    free(next->utf16be_name);
    connext = (next->contents).first;
    while (connext != (content *)0x0) {
      pcVar2 = connext->next;
      free(connext);
      connext = pcVar2;
    }
    free(next);
    next = pfVar1;
  }
  return;
}

Assistant:

static void
release_files(struct iso9660 *iso9660)
{
	struct content *con, *connext;
	struct file_info *file;

	file = iso9660->use_files;
	while (file != NULL) {
		struct file_info *next = file->use_next;

		archive_string_free(&file->name);
		archive_string_free(&file->symlink);
		free(file->utf16be_name);
		con = file->contents.first;
		while (con != NULL) {
			connext = con->next;
			free(con);
			con = connext;
		}
		free(file);
		file = next;
	}
}